

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O1

void duckdb::ArrowConverter::ToArrowSchema
               (ArrowSchema *out_schema,vector<duckdb::LogicalType,_true> *types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,ClientProperties *options)

{
  pointer pLVar1;
  DuckDBArrowSchemaHolder *__s;
  pointer pDVar2;
  reference pvVar3;
  reference ppAVar4;
  long lVar5;
  const_reference pvVar6;
  type pDVar7;
  const_reference type;
  size_type __n;
  size_type __n_00;
  size_type __new_size;
  templated_unique_single_t root_holder;
  _Head_base<0UL,_duckdb::DuckDBArrowSchemaHolder_*,_false> local_70;
  pointer local_68;
  value_type local_60;
  ArrowSchema *local_58;
  ClientProperties *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_48;
  size_type local_40;
  vector<duckdb::LogicalType,_true> *local_38;
  
  local_68 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
  pLVar1 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_58 = out_schema;
  local_50 = options;
  local_48 = names;
  local_38 = types;
  __s = (DuckDBArrowSchemaHolder *)operator_new(0xc0);
  switchD_0105b559::default(__s,0,0xc0);
  (__s->nested_children).
  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&__s->nested_children;
  (__s->nested_children).
  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&__s->nested_children;
  (__s->nested_children).
  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
  ._M_impl._M_node._M_size = 0;
  (__s->nested_children_ptr).
  super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&__s->nested_children_ptr;
  (__s->nested_children_ptr).
  super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&__s->nested_children_ptr;
  (__s->nested_children_ptr).
  super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
  ._M_impl._M_node._M_size = 0;
  (__s->owned_type_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->owned_type_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->owned_type_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__s->owned_column_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->owned_column_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->owned_column_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__s->metadata_info).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->metadata_info).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->metadata_info).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__s->extension_format).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->extension_format).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->extension_format).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_head_impl = __s;
  pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                         *)&local_70);
  __new_size = ((long)pLVar1 - (long)local_68 >> 3) * -0x5555555555555555;
  ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
            ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)pDVar2,__new_size);
  pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                         *)&local_70);
  local_60 = (value_type)0x0;
  ::std::vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>::resize
            (&(pDVar2->children_ptrs).super_vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>,
             __new_size,&local_60);
  if (pLVar1 != local_68) {
    __n = 0;
    do {
      pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                             *)&local_70);
      pvVar3 = vector<ArrowSchema,_true>::operator[](&pDVar2->children,__n);
      pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                             *)&local_70);
      ppAVar4 = vector<ArrowSchema_*,_true>::operator[](&pDVar2->children_ptrs,__n);
      *ppAVar4 = pvVar3;
      __n = __n + 1;
    } while (__new_size + (__new_size == 0) != __n);
  }
  pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                         *)&local_70);
  local_58->children =
       (pDVar2->children_ptrs).super_vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>.
       super__Vector_base<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(__new_size);
  local_58->n_children = lVar5;
  local_58->format = "+s";
  local_58->metadata = (char *)0x0;
  local_58->flags = 0;
  local_58->name = "duckdb_query_result";
  local_58->dictionary = (ArrowSchema *)0x0;
  if (pLVar1 != local_68) {
    local_40 = __new_size + (__new_size == 0);
    local_68 = (pointer)&local_50->client_context;
    __n_00 = 0;
    do {
      pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                             *)&local_70);
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](local_48,__n_00);
      AddName((duckdb *)&local_60,pvVar6);
      ::std::
      vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
      ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                  *)&pDVar2->owned_column_names,
                 (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_60);
      if (local_60 != (value_type)0x0) {
        operator_delete__(local_60);
      }
      pDVar2 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                             *)&local_70);
      pvVar3 = vector<ArrowSchema,_true>::operator[](&pDVar2->children,__n_00);
      pDVar7 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator*((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                            *)&local_70);
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](local_48,__n_00);
      InitializeChild(pvVar3,pDVar7,pvVar6);
      pDVar7 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator*((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                            *)&local_70);
      type = vector<duckdb::LogicalType,_true>::operator[](local_38,__n_00);
      optional_ptr<duckdb::ClientContext,_true>::CheckValid
                ((optional_ptr<duckdb::ClientContext,_true> *)local_68);
      SetArrowFormat(pDVar7,pvVar3,type,local_50,(local_50->client_context).ptr);
      __n_00 = __n_00 + 1;
    } while (local_40 != __n_00);
  }
  local_58->private_data = local_70._M_head_impl;
  local_58->release = ReleaseDuckDBArrowSchema;
  return;
}

Assistant:

void ArrowConverter::ToArrowSchema(ArrowSchema *out_schema, const vector<LogicalType> &types,
                                   const vector<string> &names, ClientProperties &options) {
	D_ASSERT(out_schema);
	D_ASSERT(types.size() == names.size());
	const idx_t column_count = types.size();
	// Allocate as unique_ptr first to clean-up properly on error
	auto root_holder = make_uniq<DuckDBArrowSchemaHolder>();

	// Allocate the children
	root_holder->children.resize(column_count);
	root_holder->children_ptrs.resize(column_count, nullptr);
	for (size_t i = 0; i < column_count; ++i) {
		root_holder->children_ptrs[i] = &root_holder->children[i];
	}
	out_schema->children = root_holder->children_ptrs.data();
	out_schema->n_children = NumericCast<int64_t>(column_count);

	// Store the schema
	out_schema->format = "+s"; // struct apparently
	out_schema->flags = 0;
	out_schema->metadata = nullptr;
	out_schema->name = "duckdb_query_result";
	out_schema->dictionary = nullptr;

	// Configure all child schemas
	for (idx_t col_idx = 0; col_idx < column_count; col_idx++) {
		root_holder->owned_column_names.push_back(AddName(names[col_idx]));
		auto &child = root_holder->children[col_idx];
		InitializeChild(child, *root_holder, names[col_idx]);
		SetArrowFormat(*root_holder, child, types[col_idx], options, *options.client_context);
	}

	// Release ownership to caller
	out_schema->private_data = root_holder.release();
	out_schema->release = ReleaseDuckDBArrowSchema;
}